

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

int expandvals(char *cmdp,char *valp,char *bp)

{
  int iVar1;
  ulong uVar2;
  long local_1f8;
  char *errstr;
  int local_1e8;
  int inquote;
  int fin;
  int sizof;
  int cnt;
  int spc;
  char *regs;
  char *s;
  char *v;
  char *p;
  char *endp;
  char *argp;
  char varbuf [128];
  char contbuf [128];
  char argbuf [128];
  char *bp_local;
  char *valp_local;
  char *cmdp_local;
  
  regs = " ";
  v = skipwhite(valp);
  uVar2 = strlcpy(contbuf + 0x78,v,0x80);
  if (uVar2 < 0x80) {
    endp = contbuf + 0x78;
    sizof = 0;
    fin = 0;
    errstr._4_4_ = 0;
    local_1e8 = 0;
    for (v = contbuf + 0x78; *v != '\0'; v = v + 1) {
      if (v[1] == '\0') {
        local_1e8 = 1;
      }
      if (*v != ' ') {
        if (*v == '\"') {
          errstr._4_4_ = (uint)(errstr._4_4_ != 1);
        }
        if (sizof == 1) {
          endp = v;
        }
        sizof = 0;
      }
      if ((((*v == ' ') && (errstr._4_4_ == 0)) || (local_1e8 != 0)) && (sizof != 1)) {
        if (*v == ' ') {
          *v = '\0';
        }
        p = v + 1;
        argp._0_1_ = 0;
        varbuf[0x78] = '\0';
        inquote = 0x80;
        s = (char *)&argp;
        _cnt = "[\"]+.*[\"]+";
        iVar1 = doregex("[\"]+.*[\"]+",endp);
        if (iVar1 == 0) {
          iVar1 = isvar(&endp,&s,inquote);
          if (iVar1 != 0) {
            strlcat(&argp," ",(long)inquote);
            *v = ' ';
            strlcpy(varbuf + 0x78,p,0x80);
            strlcat(&argp,varbuf + 0x78,(long)inquote);
            contbuf[0x78] = ' ';
            contbuf[0x79] = '\0';
            strlcat(contbuf + 0x78,&argp,(long)inquote);
            v = contbuf + 0x78;
            sizof = 1;
            local_1e8 = 0;
            endp = v;
            goto LAB_0012edb1;
          }
          strtonum(endp,0,0x7fffffff,&local_1f8);
          if (local_1f8 != 0) {
            iVar1 = dobeep_msgs("Var not found:",endp);
            return iVar1;
          }
        }
        if ((*bp != '\0') && (uVar2 = strlcat(bp,regs,0x80), 0x7f < uVar2)) {
          iVar1 = dobeep_msg("strlcat error");
          return iVar1;
        }
        uVar2 = strlcat(bp,endp,0x80);
        if (0x7f < uVar2) {
          iVar1 = dobeep_msg("strlcat error");
          return iVar1;
        }
        if (local_1e8 != 0) break;
        *v = ' ';
        sizof = 1;
      }
LAB_0012edb1:
    }
    cmdp_local._4_4_ = 1;
  }
  else {
    cmdp_local._4_4_ = dobeep_msg("strlcpy error");
  }
  return cmdp_local._4_4_;
}

Assistant:

static int
expandvals(char *cmdp, char *valp, char *bp)
{
	char	 argbuf[BUFSIZE];
	char	 contbuf[BUFSIZE], varbuf[BUFSIZE];
	char	*argp, *endp, *p, *v, *s = " ";
	char	*regs;
	int	 spc, cnt;
	int	 sizof, fin, inquote;

	/* now find the first argument */
	p = skipwhite(valp);

	if (strlcpy(argbuf, p, sizeof(argbuf)) >= sizeof(argbuf))
		return (dobeep_msg("strlcpy error"));
	argp = argbuf;
	spc = 1; /* initially fake a space so we find first argument */
	fin = inquote = cnt = spc = 0;

	for (p = argbuf; *p != '\0'; p++) {
		if (*(p + 1) == '\0')
			fin = 1;

		if (*p != ' ') {
			if (*p == '"') {
				if (inquote == 1)
					inquote = 0;
				else
					inquote = 1;
			}
			if (spc == 1)
				argp = p;
			spc = 0;
		}
		if ((*p == ' ' && inquote == 0) || fin) {
			if (spc == 1)
				continue;
			/* terminate arg string */
			if (*p == ' ') {
				*p = '\0';
			}
			endp = p + 1;
			varbuf[0] = '\0';
			contbuf[0] = '\0';
			sizof = sizeof(varbuf);
			v = varbuf;
			regs = "[\"]+.*[\"]+";
       			if (doregex(regs, argp))
				;			/* found quotes */
			else if (isvar(&argp, &v, sizof)) {

				(void)(strlcat(varbuf, " ",
                                    sizof) >= sizof);

				*p = ' ';
				(void)(strlcpy(contbuf, endp,
				    sizeof(contbuf)) >= sizeof(contbuf));

				(void)(strlcat(varbuf, contbuf,
				    sizof) >= sizof);

				argbuf[0] = ' ';
				argbuf[1] = '\0';
				(void)(strlcat(argbuf, varbuf,
				    sizof) >= sizof);

				p = argp = argbuf;
				spc = 1;
				fin = 0;
				continue;
			} else {
				const char *errstr;

				strtonum(argp, 0, INT_MAX, &errstr);
				if (errstr != NULL)
					return (dobeep_msgs("Var not found:",
					    argp));
			}
#ifdef  MGLOG
        mglog_misc("x|%s|%p|%d|\n", bp, defnam, BUFSIZE);
#endif
			if (*bp != '\0') {
				if (strlcat(bp, s, BUFSIZE) >= BUFSIZE)
					return (dobeep_msg("strlcat error"));
			}
			if (strlcat(bp, argp, BUFSIZE) >= BUFSIZE) {
				return (dobeep_msg("strlcat error"));
			}
/*			v1->v_count++;*/

			if (fin)
				break;

			*p = ' ';		/* unterminate arg string */
			spc = 1;
		}
	}
	return (TRUE);
}